

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O1

void __thiscall aeron::ClientConductor::onClientTimeout(ClientConductor *this,int64_t clientId)

{
  longlong now;
  char *pcVar1;
  ClientTimeoutException exception;
  allocator local_c1;
  string local_c0;
  string local_a0;
  string local_80;
  undefined1 local_60 [40];
  _Alloc_hider local_38;
  undefined **local_28 [2];
  
  if ((this->m_driverProxy->m_clientId == clientId) && (((this->m_isClosed)._M_base._M_i & 1U) == 0)
     ) {
    if ((this->m_epochClock).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    now = (*(this->m_epochClock)._M_invoker)((_Any_data *)&this->m_epochClock);
    closeAllResources(this,now);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"client timeout from driver","");
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"void aeron::ClientConductor::onClientTimeout(std::int64_t)","");
    pcVar1 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                               ,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/ClientConductor.cpp"
                              );
    std::__cxx11::string::string((string *)&local_80,pcVar1,&local_c1);
    util::SourcedException::SourcedException
              ((SourcedException *)local_60,&local_a0,&local_c0,&local_80,0x2cc);
    local_60._0_8_ = &PTR__SourcedException_00164818;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((this->m_errorHandler).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->m_errorHandler)._M_invoker)((_Any_data *)&this->m_errorHandler,(exception *)local_60);
    local_60._0_8_ = &PTR__SourcedException_00163a58;
    if ((undefined ***)local_38._M_p != local_28) {
      operator_delete(local_38._M_p);
    }
    if ((undefined1 *)local_60._8_8_ != local_60 + 0x18) {
      operator_delete((void *)local_60._8_8_);
    }
    std::exception::~exception((exception *)local_60);
  }
  return;
}

Assistant:

void ClientConductor::onClientTimeout(std::int64_t clientId)
{
    if (m_driverProxy.clientId() == clientId && !isClosed())
    {
        const long long now = m_epochClock();

        closeAllResources(now);

        ClientTimeoutException exception("client timeout from driver", SOURCEINFO);
        m_errorHandler(exception);
    }
}